

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixmapcache.cpp
# Opt level: O2

bool __thiscall QPMCache::insert(QPMCache *this,QString *key,QPixmap *pixmap,int cost)

{
  KeyData *pKVar1;
  Key *pKVar2;
  bool bVar3;
  long in_FS_OFFSET;
  Key k;
  Key local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  remove(this,(char *)key);
  local_38.d = (KeyData *)&DAT_aaaaaaaaaaaaaaaa;
  insert((QPMCache *)&stack0xffffffffffffffc8,(QPixmap *)this,(int)pixmap);
  if ((local_38.d == (KeyData *)0x0) || ((local_38.d)->isValid != true)) {
    bVar3 = false;
  }
  else {
    QString::operator=(&(local_38.d)->stringKey,(QString *)key);
    pKVar2 = QHash<QString,_QPixmapCache::Key>::operator[](&this->cacheKeys,key);
    pKVar1 = pKVar2->d;
    pKVar2->d = local_38.d;
    bVar3 = true;
    local_38.d = pKVar1;
  }
  QPixmapCache::Key::~Key(&stack0xffffffffffffffc8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool QPMCache::insert(const QString& key, const QPixmap &pixmap, int cost)
{
    //If for the same key we add already a pixmap we should delete it
    remove(key);

    // this will create a new key; the old one has been removed
    auto k = insert(pixmap, cost);
    if (k.isValid()) {
        k.d->stringKey = key;
        cacheKeys[key] = std::move(k);
        return true;
    }
    return false;
}